

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void Cmd_net_addcontroller(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  
  if (netgame) {
    iVar1 = FCommandLine::argc(argv);
    if (1 < iVar1) {
      pcVar2 = FCommandLine::operator[](argv,1);
      iVar1 = atoi(pcVar2);
      Network_Controller(iVar1,true);
      return;
    }
    pcVar2 = "Usage: net_addcontroller <player>\n";
  }
  else {
    pcVar2 = "This command can only be used when playing a net game.\n";
  }
  Printf(pcVar2);
  return;
}

Assistant:

CCMD (net_addcontroller)
{
	if (!netgame)
	{
		Printf ("This command can only be used when playing a net game.\n");
		return;
	}

	if (argv.argc () < 2)
	{
		Printf ("Usage: net_addcontroller <player>\n");
		return;
	}

	Network_Controller (atoi (argv[1]), true);
}